

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skew.cpp
# Opt level: O1

void duckdb::SkewnessOperation::Finalize<double,duckdb::SkewState>
               (SkewState *state,double *target,AggregateFinalizeData *finalize_data)

{
  double __x;
  double dVar1;
  double dVar2;
  ulong uVar3;
  char cVar4;
  OutOfRangeException *this;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar3 = state->n;
  if (uVar3 < 3) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  auVar8._8_4_ = (int)(uVar3 >> 0x20);
  auVar8._0_8_ = uVar3;
  auVar8._12_4_ = 0x45300000;
  dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  dVar10 = 1.0 / dVar9;
  dVar5 = pow((state->sum_sqr - state->sum * state->sum * dVar10) * dVar10,3.0);
  dVar6 = 0.0;
  if (0.0 <= dVar5) {
    dVar6 = dVar5;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar5 = (dVar9 + -1.0) * dVar9;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    __x = state->sum;
    dVar1 = state->sum_sqr;
    dVar2 = state->sum_cub;
    dVar7 = pow(__x,3.0);
    dVar6 = (((dVar7 + dVar7) * dVar10 * dVar10 + dVar1 * -3.0 * __x * dVar10 + dVar2) *
            (dVar5 / (dVar9 + -2.0)) * dVar10) / dVar6;
    *target = dVar6;
    cVar4 = duckdb::Value::DoubleIsFinite(dVar6);
    if (cVar4 == '\0') {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"SKEW is out of range!","")
      ;
      duckdb::OutOfRangeException::OutOfRangeException(this,(string *)local_40);
      __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    *target = NAN;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.n <= 2) {
			finalize_data.ReturnNull();
			return;
		}
		double n = state.n;
		double temp = 1 / n;
		auto p = std::pow(temp * (state.sum_sqr - state.sum * state.sum * temp), 3);
		if (p < 0) {
			p = 0; // Shouldn't be below 0 but floating points are weird
		}
		double div = std::sqrt(p);
		if (div == 0) {
			target = NAN;
			return;
		}
		double temp1 = std::sqrt(n * (n - 1)) / (n - 2);
		target = temp1 * temp *
		         (state.sum_cub - 3 * state.sum_sqr * state.sum * temp + 2 * pow(state.sum, 3) * temp * temp) / div;
		if (!Value::DoubleIsFinite(target)) {
			throw OutOfRangeException("SKEW is out of range!");
		}
	}